

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall
LinearScan::ProcessSecondChanceBoundaryHelper
          (LinearScan *this,BranchInstr *branchInstr,LabelInstr *branchLabel)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  uint32 uVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  LoweredBasicBlock *pLVar8;
  bool local_49;
  Instr *branchNextInstr;
  Instr *nextInstr;
  LabelInstr *branchLabel_local;
  BranchInstr *branchInstr_local;
  LinearScan *this_local;
  
  uVar4 = IR::Instr::GetNumber(&branchInstr->super_Instr);
  uVar5 = IR::Instr::GetNumber(&branchLabel->super_Instr);
  if (uVar5 < uVar4) {
    if ((branchLabel->field_0x78 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xebe,"(branchLabel->m_isLoopTop)","branchLabel->m_isLoopTop");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    branchInstr->m_regContent = (Lifetime **)0x0;
    InsertSecondChanceCompensation
              (this,this->regContent,branchLabel->m_regContent,branchInstr,branchLabel);
  }
  else {
    SaveRegContent(this,&branchInstr->super_Instr);
    if (this->curLoop != (Loop *)0x0) {
      SList<Lifetime_**,_Memory::ArenaAllocator,_RealCount>::Prepend
                ((this->curLoop->regAlloc).exitRegContentList,&branchInstr->m_regContent);
    }
    if (branchLabel->m_loweredBasicBlock == (LoweredBasicBlock *)0x0) {
      bVar2 = IR::BranchInstr::IsConditional(branchInstr);
      if ((bVar2) || (bVar2 = IR::BranchInstr::IsMultiBranch(branchInstr), bVar2)) {
        pLVar8 = LoweredBasicBlock::Clone(this->currentBlock,this->tempAlloc);
        branchLabel->m_loweredBasicBlock = pLVar8;
      }
      else {
        pIVar7 = IR::Instr::GetNextRealInstr(&branchLabel->super_Instr);
        if (((pIVar7->m_opcode != FunctionExit) && (pIVar7->m_opcode != BailOutStackRestore)) &&
           (bVar2 = LoweredBasicBlock::HasData(this->currentBlock), bVar2)) {
          pIVar7 = IR::Instr::GetNextRealInstrOrLabel(&branchInstr->super_Instr);
          IVar3 = IR::Instr::GetKind(pIVar7);
          local_49 = true;
          if (IVar3 != InstrKindLabel) {
            local_49 = IR::Instr::IsProfiledLabelInstr(pIVar7);
          }
          if (local_49 == false) {
            pLVar8 = LoweredBasicBlock::Clone(this->currentBlock,this->tempAlloc);
            branchLabel->m_loweredBasicBlock = pLVar8;
          }
          else {
            branchLabel->m_loweredBasicBlock = this->currentBlock;
          }
        }
      }
    }
    else {
      bVar2 = LoweredBasicBlock::HasData(this->currentBlock);
      if ((bVar2) &&
         (bVar2 = LoweredBasicBlock::Equals(branchLabel->m_loweredBasicBlock,this->currentBlock),
         !bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xeec,
                           "(!currentBlock->HasData() || branchLabel->m_loweredBasicBlock->Equals(this->currentBlock))"
                           ,
                           "!currentBlock->HasData() || branchLabel->m_loweredBasicBlock->Equals(this->currentBlock)"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  return;
}

Assistant:

void
LinearScan::ProcessSecondChanceBoundaryHelper(IR::BranchInstr *branchInstr, IR::LabelInstr *branchLabel)
{
    if (branchInstr->GetNumber() > branchLabel->GetNumber())
    {
        // Loop back-edge
        Assert(branchLabel->m_isLoopTop);
        branchInstr->m_regContent = nullptr;
        this->InsertSecondChanceCompensation(this->regContent, branchLabel->m_regContent, branchInstr, branchLabel);
    }
    else
    {
        // Forward branch
        this->SaveRegContent(branchInstr);
        if (this->curLoop)
        {
            this->curLoop->regAlloc.exitRegContentList->Prepend(branchInstr->m_regContent);
        }
        if (!branchLabel->m_loweredBasicBlock)
        {
            if (branchInstr->IsConditional() || branchInstr->IsMultiBranch())
            {
                // Clone with deep copy
                branchLabel->m_loweredBasicBlock = this->currentBlock->Clone(this->tempAlloc);
            }
            else
            {
                // If the unconditional branch leads to the end of the function for the scenario of a bailout - we do not want to
                // copy the lowered inlinee info.
                IR::Instr* nextInstr = branchLabel->GetNextRealInstr();
                if (nextInstr->m_opcode != Js::OpCode::FunctionExit &&
                    nextInstr->m_opcode != Js::OpCode::BailOutStackRestore &&
                    this->currentBlock->HasData())
                {
                    IR::Instr* branchNextInstr = branchInstr->GetNextRealInstrOrLabel();
                    if (branchNextInstr->IsLabelInstr())
                    {
                        // Clone with shallow copy
                        branchLabel->m_loweredBasicBlock = this->currentBlock;
                    }
                    else
                    {
                        // Dead code after the unconditional branch causes the currentBlock data to be freed later on...
                        // Deep copy in this case.
                        branchLabel->m_loweredBasicBlock = this->currentBlock->Clone(this->tempAlloc);
                    }
                }
            }
        }
        else
        {
            // The lowerer sometimes generates unreachable blocks that would have empty data.
            Assert(!currentBlock->HasData() || branchLabel->m_loweredBasicBlock->Equals(this->currentBlock));
        }
    }
}